

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZKrylovEigenSolver.cpp
# Opt level: O2

int __thiscall
TPZKrylovEigenSolver<std::complex<double>_>::SolveGeneralisedEigenProblem
          (TPZKrylovEigenSolver<std::complex<double>_> *this,TPZVec<std::complex<double>_> *w)

{
  int iVar1;
  TPZFMatrix<std::complex<double>_> eigenVectors;
  TPZFMatrix<std::complex<double>_> TStack_a8;
  
  TPZFMatrix<std::complex<double>_>::TPZFMatrix(&TStack_a8);
  iVar1 = SolveImpl(this,w,&TStack_a8,false);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&TStack_a8);
  return iVar1;
}

Assistant:

int TPZKrylovEigenSolver<TVar>::SolveGeneralisedEigenProblem(TPZVec<CTVar> &w)
{
  TPZFMatrix<CTVar> eigenVectors;
  return SolveImpl(w, eigenVectors,false);
}